

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_secrets.cpp
# Opt level: O3

void duckdb::DuckDBSecretsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  pointer pbVar2;
  pointer pcVar3;
  CatalogTransaction transaction_00;
  idx_t index;
  SecretManager *this;
  _func_int **pp_Var4;
  idx_t iVar5;
  reference pvVar6;
  pointer pBVar7;
  type pBVar8;
  _func_int **pp_Var9;
  pointer pbVar10;
  _func_int **__n;
  vector<duckdb::Value,_true> scope_value;
  CatalogTransaction transaction;
  vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_> local_1c8;
  GlobalTableFunctionState *local_1b0;
  vector<duckdb::SecretEntry,_true> *local_1a8;
  FunctionData *local_1a0;
  idx_t local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  LogicalType local_110;
  _func_int **local_f8;
  element_type *peStack_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  string local_b0;
  string local_90;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_70 [24];
  CatalogTransaction local_58;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  local_1a0 = (data_p->bind_data).ptr;
  this = SecretManager::Get(context);
  CatalogTransaction::GetSystemCatalogTransaction(&local_58,context);
  pp_Var9 = pGVar1[2]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[3]._vptr_GlobalTableFunctionState;
  if (pp_Var9 == pp_Var4) {
    transaction_00.context.ptr = local_58.context.ptr;
    transaction_00.db.ptr = local_58.db.ptr;
    transaction_00.transaction.ptr = local_58.transaction.ptr;
    transaction_00.transaction_id = local_58.transaction_id;
    transaction_00.start_time = local_58.start_time;
    SecretManager::AllSecrets((vector<duckdb::SecretEntry,_true> *)&local_1c8,this,transaction_00);
    local_e8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pGVar1[4]._vptr_GlobalTableFunctionState;
    local_f8 = pGVar1[2]._vptr_GlobalTableFunctionState;
    peStack_f0 = (element_type *)pGVar1[3]._vptr_GlobalTableFunctionState;
    pGVar1[2]._vptr_GlobalTableFunctionState =
         (_func_int **)
         local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    pGVar1[3]._vptr_GlobalTableFunctionState =
         (_func_int **)
         local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pGVar1[4]._vptr_GlobalTableFunctionState =
         (_func_int **)
         local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>::~vector
              ((vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_> *)&local_f8);
    ::std::vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>::~vector(&local_1c8);
    pp_Var9 = pGVar1[2]._vptr_GlobalTableFunctionState;
    pp_Var4 = pGVar1[3]._vptr_GlobalTableFunctionState;
  }
  __n = pGVar1[1]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var4 - (long)pp_Var9 >> 4) * -0x5555555555555555)) {
    local_1a8 = (vector<duckdb::SecretEntry,_true> *)(pGVar1 + 2);
    iVar5 = 0;
    local_1b0 = pGVar1;
    do {
      local_198 = iVar5;
      pvVar6 = vector<duckdb::SecretEntry,_true>::operator[](local_1a8,(size_type)__n);
      local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar7 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(&pvVar6->secret);
      pbVar2 = (pBVar7->prefix_paths).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (pBVar7->prefix_paths).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
          pbVar10 = pbVar10 + 1) {
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + pbVar10->_M_string_length);
        Value::Value((Value *)&local_f8,&local_90);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,
                   (Value *)&local_f8);
        Value::~Value((Value *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      pBVar8 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator*(&pvVar6->secret);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      pcVar3 = (pBVar8->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + (pBVar8->name)._M_string_length);
      index = local_198;
      Value::Value((Value *)&local_f8,&local_130);
      DataChunk::SetValue(output,0,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      pcVar3 = (pBVar8->type)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar3,pcVar3 + (pBVar8->type)._M_string_length);
      Value::Value((Value *)&local_f8,&local_150);
      DataChunk::SetValue(output,1,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      pcVar3 = (pBVar8->provider)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (pBVar8->provider)._M_string_length);
      Value::Value((Value *)&local_f8,&local_170);
      DataChunk::SetValue(output,2,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      Value::Value((Value *)&local_f8,pvVar6->persist_type == PERSISTENT);
      DataChunk::SetValue(output,3,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      pcVar3 = (pvVar6->storage_mode)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar3,pcVar3 + (pvVar6->storage_mode)._M_string_length);
      Value::Value((Value *)&local_f8,&local_190);
      DataChunk::SetValue(output,4,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      LogicalType::LogicalType(&local_110,VARCHAR);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                (local_70,(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8);
      Value::LIST((Value *)&local_f8,&local_110,(vector<duckdb::Value,_true> *)local_70);
      DataChunk::SetValue(output,5,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_70);
      LogicalType::~LogicalType(&local_110);
      (*pBVar8->_vptr_BaseSecret[3])
                (&local_b0,pBVar8,(ulong)*(byte *)&local_1a0[1]._vptr_FunctionData);
      Value::Value((Value *)&local_f8,&local_b0);
      DataChunk::SetValue(output,6,index,(Value *)&local_f8);
      Value::~Value((Value *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      pGVar1 = local_1b0;
      local_1b0[1]._vptr_GlobalTableFunctionState =
           (_func_int **)((long)local_1b0[1]._vptr_GlobalTableFunctionState + 1);
      iVar5 = index + 1;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8);
      __n = pGVar1[1]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pGVar1[3]._vptr_GlobalTableFunctionState -
                      (long)pGVar1[2]._vptr_GlobalTableFunctionState >> 4) * -0x5555555555555555))
            && (index < 0x7ff));
    output->count = iVar5;
  }
  return;
}

Assistant:

void DuckDBSecretsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBSecretsData>();
	auto &bind_data = data_p.bind_data->Cast<DuckDBSecretsBindData>();

	auto &secret_manager = SecretManager::Get(context);

	auto transaction = CatalogTransaction::GetSystemCatalogTransaction(context);

	if (data.secrets.empty()) {
		data.secrets = secret_manager.AllSecrets(transaction);
	}
	auto &secrets = data.secrets;
	if (data.offset >= secrets.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < secrets.size() && count < STANDARD_VECTOR_SIZE) {
		auto &secret_entry = secrets[data.offset];

		vector<Value> scope_value;
		for (const auto &scope_entry : secret_entry.secret->GetScope()) {
			scope_value.push_back(scope_entry);
		}

		const auto &secret = *secret_entry.secret;

		idx_t i = 0;
		// name
		output.SetValue(i++, count, secret.GetName());
		// type
		output.SetValue(i++, count, Value(secret.GetType()));
		// provider
		output.SetValue(i++, count, Value(secret.GetProvider()));
		// persistent
		output.SetValue(i++, count, Value(secret_entry.persist_type == SecretPersistType::PERSISTENT));
		// storage
		output.SetValue(i++, count, Value(secret_entry.storage_mode));
		// scope
		output.SetValue(i++, count, Value::LIST(LogicalType::VARCHAR, scope_value));
		// secret_string
		output.SetValue(i++, count, secret.ToString(bind_data.redact));

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}